

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int fmt::v9::detail::snprintf_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  size_t sVar1;
  uint uVar2;
  byte *pbVar3;
  ulong uVar4;
  ulong __maxlen;
  char format [7];
  char local_3f [7];
  double local_38;
  
  local_3f[0] = '%';
  if ((specs._4_4_ >> 0x13 & 1) == 0) {
    pbVar3 = (byte *)(local_3f + 1);
  }
  else {
    pbVar3 = (byte *)(local_3f + 2);
    local_3f[1] = 0x23;
  }
  if (-1 < precision) {
    pbVar3[0] = 0x2e;
    pbVar3[1] = 0x2a;
    pbVar3 = pbVar3 + 2;
  }
  *pbVar3 = ((specs._4_4_ >> 0x10 & 1) == 0) << 5 | 0x41;
  pbVar3[1] = 0;
  sVar1 = buf->size_;
  local_38 = value;
LAB_0012bdf2:
  do {
    __maxlen = buf->capacity_ - sVar1;
    if (precision < 0) {
      uVar2 = snprintf(buf->ptr_ + sVar1,__maxlen,local_3f,local_38);
    }
    else {
      uVar2 = snprintf(buf->ptr_ + sVar1,__maxlen,local_3f,local_38,precision);
    }
    if ((int)uVar2 < 0) goto LAB_0012be3e;
    uVar4 = (ulong)uVar2;
    if (uVar4 < __maxlen) {
      buffer<char>::try_resize(buf,sVar1 + uVar4);
      return 0;
    }
    uVar4 = uVar4 + sVar1 + 1;
  } while (uVar4 <= buf->capacity_);
  goto LAB_0012be4b;
LAB_0012be3e:
  if (buf->capacity_ != 0xffffffffffffffff) {
    uVar4 = buf->capacity_ + 1;
LAB_0012be4b:
    (**buf->_vptr_buffer)(buf,uVar4);
  }
  goto LAB_0012bdf2;
}

Assistant:

auto snprintf_float(T value, int precision, float_specs specs,
                    buffer<char>& buf) -> int {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  FMT_ASSERT(specs.format == float_format::hex, "");
  static_assert(!std::is_same<T, float>::value, "");

  // Build the format string.
  char format[7];  // The longest format is "%#.*Le".
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.showpoint) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.upper ? 'A' : 'a';
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
    abort_fuzzing_if(precision > 100000);
    // Suppress the warning about a nonliteral format string.
    // Cannot use auto because of a bug in MinGW (#1532).
    int (*snprintf_ptr)(char*, size_t, const char*, ...) = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      // The buffer will grow exponentially.
      buf.try_reserve(buf.capacity() + 1);
      continue;
    }
    auto size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size < capacity) {
      buf.try_resize(size + offset);
      return 0;
    }
    buf.try_reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
  }
}